

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O2

void __thiscall Spaghetti<UF>::SecondScan(Spaghetti<UF> *this)

{
  bool bVar1;
  Mat1b *pMVar2;
  Mat1i *pMVar3;
  uint *puVar4;
  uint *puVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  
  uVar6 = UF::Flatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar6;
  puVar4 = UF::P_;
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  bVar1 = this->o_cols;
  lVar12 = 1;
  lVar7 = 0;
  do {
    puVar5 = UF::P_;
    if (*(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 <= lVar7) {
      if (this->o_rows == true) {
        lVar9 = **(long **)&pMVar2->field_0x48 * lVar7 + *(long *)&pMVar2->field_0x10;
        lVar12 = lVar7 * **(long **)&pMVar3->field_0x48 + *(long *)&pMVar3->field_0x10;
        for (lVar7 = 0; lVar7 < this->e_cols; lVar7 = lVar7 + 2) {
          lVar13 = (long)*(int *)(lVar12 + lVar7 * 4);
          if (lVar13 < 1) {
            *(undefined8 *)(lVar12 + lVar7 * 4) = 0;
          }
          else {
            uVar6 = puVar5[lVar13];
            uVar10 = uVar6;
            if (*(char *)(lVar9 + lVar7) == '\0') {
              uVar10 = 0;
            }
            *(uint *)(lVar12 + lVar7 * 4) = uVar10;
            if (*(char *)(lVar9 + 1 + lVar7) == '\0') {
              *(undefined4 *)(lVar12 + 4 + lVar7 * 4) = 0;
            }
            else {
              *(uint *)(lVar12 + 4 + lVar7 * 4) = uVar6;
            }
          }
        }
        if ((bVar1 & 1U) != 0) {
          lVar13 = (long)*(int *)(lVar12 + lVar7 * 4);
          uVar6 = 0;
          if ((0 < lVar13) && (uVar6 = 0, *(char *)(lVar7 + lVar9) != '\0')) {
            uVar6 = UF::P_[lVar13];
          }
          *(uint *)(lVar12 + lVar7 * 4) = uVar6;
        }
      }
      return;
    }
    lVar9 = **(long **)&pMVar3->field_0x48;
    lVar16 = lVar9 * lVar7 + *(long *)&pMVar3->field_0x10;
    lVar13 = lVar9 * lVar12 + *(long *)&pMVar3->field_0x10;
    lVar14 = **(long **)&pMVar2->field_0x48 * lVar12 + *(long *)&pMVar2->field_0x10;
    lVar17 = **(long **)&pMVar2->field_0x48 * lVar7 + *(long *)&pMVar2->field_0x10;
    for (uVar15 = 0; (long)uVar15 < (long)this->e_cols; uVar15 = uVar15 + 2) {
      lVar8 = (long)*(int *)(lVar16 + uVar15 * 4);
      if (lVar8 < 1) {
        *(undefined8 *)(lVar16 + uVar15 * 4) = 0;
        uVar11 = uVar15 | 1;
        *(undefined4 *)(lVar13 + uVar15 * 4) = 0;
        uVar6 = 0;
      }
      else {
        uVar6 = puVar5[lVar8];
        uVar10 = uVar6;
        if (*(char *)(lVar17 + uVar15) == '\0') {
          uVar10 = 0;
        }
        *(uint *)(lVar16 + uVar15 * 4) = uVar10;
        uVar10 = uVar6;
        if (*(char *)(lVar17 + 1 + uVar15) == '\0') {
          uVar10 = 0;
        }
        uVar11 = uVar15 + 1;
        *(uint *)(lVar16 + 4 + uVar15 * 4) = uVar10;
        uVar10 = uVar6;
        if (*(char *)(lVar14 + uVar15) == '\0') {
          uVar10 = 0;
        }
        *(uint *)(lVar13 + uVar15 * 4) = uVar10;
        if (*(char *)(lVar14 + 1 + uVar15) == '\0') {
          uVar6 = 0;
        }
      }
      *(uint *)(lVar16 + lVar9 + uVar11 * 4) = uVar6;
    }
    if ((bVar1 & 1U) != 0) {
      lVar9 = (long)*(int *)(lVar16 + uVar15 * 4);
      if (lVar9 < 1) {
        *(undefined4 *)(lVar16 + uVar15 * 4) = 0;
      }
      else {
        uVar6 = puVar4[lVar9];
        uVar10 = uVar6;
        if (*(char *)(uVar15 + lVar17) == '\0') {
          uVar10 = 0;
        }
        *(uint *)(lVar16 + uVar15 * 4) = uVar10;
        if (*(char *)(uVar15 + lVar14) != '\0') {
          *(uint *)(lVar13 + uVar15 * 4) = uVar6;
          goto LAB_00136bfb;
        }
      }
      *(undefined4 *)(lVar13 + uVar15 * 4) = 0;
    }
LAB_00136bfb:
    lVar7 = lVar7 + 2;
    lVar12 = lVar12 + 2;
  } while( true );
}

Assistant:

void SecondScan()
	{   // Second scan
		n_labels_ = LabelsSolver::Flatten();

		int r = 0;
		for (; r < e_rows; r += 2) {
			// Get rows pointer
			const unsigned char* const img_row = img_.ptr<unsigned char>(r);
			const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);

			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
			unsigned* const img_labels_row_fol = (unsigned*)(((char*)img_labels_row) + img_labels_.step.p[0]);
			int c = 0;
			for (; c < e_cols; c += 2) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row[c + 1] > 0)
						img_labels_row[c + 1] = iLabel;
					else
						img_labels_row[c + 1] = 0;
					if (img_row_fol[c] > 0)
						img_labels_row_fol[c] = iLabel;
					else
						img_labels_row_fol[c] = 0;
					if (img_row_fol[c + 1] > 0)
						img_labels_row_fol[c + 1] = iLabel;
					else
						img_labels_row_fol[c + 1] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row[c + 1] = 0;
					img_labels_row_fol[c] = 0;
					img_labels_row_fol[c + 1] = 0;
				}
			}
			// Last column if the number of columns is odd
			if (o_cols) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row_fol[c] > 0)
						img_labels_row_fol[c] = iLabel;
					else
						img_labels_row_fol[c] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row_fol[c] = 0;
				}
			}
		}
		// Last row if the number of rows is odd
		if (o_rows) {
			// Get rows pointer
			const unsigned char* const img_row = img_.ptr<unsigned char>(r);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
			int c = 0;
			for (; c < e_cols; c += 2) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row[c + 1] > 0)
						img_labels_row[c + 1] = iLabel;
					else
						img_labels_row[c + 1] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row[c + 1] = 0;
				}
			}
			// Last column if the number of columns is odd
			if (o_cols) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
				}
				else {
					img_labels_row[c] = 0;
				}
			}
		}
	}